

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

string * __thiscall
cppcms::widgets::checkbox::identification_abi_cxx11_(string *__return_storage_ptr__,checkbox *this)

{
  long lVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar1 = *(long *)&(this->super_base_html_input).field_0x38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar1,
             *(long *)&(this->super_base_html_input).field_0x40 + lVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string checkbox::identification()
{
	return identification_;
}